

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int CVodeGetJac(void *cvode_mem,SUNMatrix *J)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetJac",&local_10,&local_18);
  if (iVar1 == 0) {
    *J = local_18->savedJ;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeGetJac(void* cvode_mem, SUNMatrix* J)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return retval; }
  *J = cvls_mem->savedJ;
  return CVLS_SUCCESS;
}